

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O2

TPZSavable * __thiscall
TPZRestoreClass<TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>_>::Restore
          (TPZRestoreClass<TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>_> *this)

{
  TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra> *this_00;
  
  this_00 = (TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra> *)operator_new(200);
  TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>::TPZCompElKernelHDiv3D(this_00);
  return (TPZSavable *)
         ((long)(this_00->super_TPZCompElHCurl<pzshape::TPZShapeTetra>).fConnectIndexes.fExtAlloc +
         *(long *)(*(long *)&(this_00->super_TPZCompElHCurl<pzshape::TPZShapeTetra>).
                             super_TPZIntelGen<pzshape::TPZShapeTetra>.super_TPZInterpolatedElement.
                             super_TPZInterpolationSpace.super_TPZCompEl + -0x60) + -0x68);
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }